

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  char cVar1;
  connectdata *conn_00;
  unsigned_short uVar2;
  ushort uVar3;
  uint uVar4;
  CURLcode CVar5;
  int iVar6;
  CURLcode error;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  int *piVar11;
  long lVar12;
  uint uVar13;
  Curl_addrinfo *ai;
  char cVar14;
  SessionHandle *pSVar15;
  ftpport fVar16;
  uint uVar17;
  bool bVar18;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *h;
  Curl_sockaddr_storage ss;
  char myhost [256];
  char tmp [1024];
  char hbuf [1025];
  curl_socket_t local_9fc;
  SessionHandle *local_9f8;
  socklen_t local_9f0;
  undefined4 local_9ec;
  uint local_9e8;
  undefined4 local_9e4;
  connectdata *local_9e0;
  uint local_9d8;
  ftpport local_9d4;
  pingpong *local_9d0;
  ulong local_9c8;
  Curl_dns_entry *local_9c0;
  sockaddr local_9b8 [8];
  char local_938 [256];
  char local_838 [1024];
  char local_438 [1032];
  
  pSVar15 = conn->data;
  local_9fc = -1;
  local_9d4 = fcmd;
  pcVar7 = (char *)memset(local_938,0,0x100);
  pcVar9 = (pSVar15->set).str[9];
  local_9c0 = (Curl_dns_entry *)0x0;
  if ((pcVar9 == (char *)0x0) || (pcVar7 = (char *)strlen(pcVar9), pcVar7 < (char *)0x2)) {
    pcVar9 = (char *)0x0;
    uVar13 = 0;
    local_9ec = 0;
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (char *)0x11;
    if ((char *)0xf < pcVar7) {
      pcVar8 = pcVar7 + 1;
    }
    pcVar8 = (char *)(*Curl_ccalloc)((size_t)pcVar8,1);
    if (pcVar8 == (char *)0x0) {
      pcVar9 = (char *)0x0;
      uVar13 = 0;
      local_9ec = 0;
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = pcVar9;
      if (*pcVar9 != ':') {
        pcVar7 = strchr(pcVar9,0x3a);
        if (pcVar7 == (char *)0x0) {
          strcpy(pcVar8,pcVar9);
          pcVar7 = (char *)0x0;
        }
        else {
          strncpy(pcVar8,pcVar9,(long)pcVar7 - (long)pcVar9);
        }
      }
      if ((pcVar7 == (char *)0x0) || (pcVar9 = strchr(pcVar7,0x3a), pcVar9 == (char *)0x0)) {
        uVar17 = 0;
        uVar4 = 0;
      }
      else {
        uVar10 = strtoul(pcVar9 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar10);
        uVar17 = (uint)CONCAT62(extraout_var,uVar2);
        pcVar9 = strchr(pcVar9,0x2d);
        uVar4 = uVar17;
        if (pcVar9 != (char *)0x0) {
          uVar10 = strtoul(pcVar9 + 1,(char **)0x0,10);
          uVar2 = curlx_ultous(uVar10);
          uVar4 = (uint)CONCAT62(extraout_var_00,uVar2);
        }
      }
      uVar13 = uVar17;
      if ((ushort)uVar4 < (ushort)uVar17) {
        uVar13 = 0;
      }
      pcVar7 = (char *)(ulong)uVar4;
      if ((ushort)uVar4 < (ushort)uVar17) {
        pcVar7 = (char *)0x0;
      }
      local_9ec = SUB84(pcVar7,0);
      pcVar9 = (char *)0x0;
      if (*pcVar8 != '\0') {
        pcVar7 = Curl_if2ip(conn->ip_addr->ai_family,pcVar8,local_438,0x401);
        pcVar9 = local_438;
        if (pcVar7 == (char *)0x0) {
          pcVar9 = pcVar8;
        }
      }
    }
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  local_9e4 = (undefined4)CONCAT71((int7)((ulong)pcVar7 >> 8),pcVar9 != (char *)0x0);
  if (pcVar9 == (char *)0x0) {
    local_9f0 = 0x80;
    iVar6 = getsockname(conn->sock[0],local_9b8,&local_9f0);
    if (iVar6 != 0) {
      piVar11 = __errno_location();
      pcVar9 = Curl_strerror(conn,*piVar11);
      pcVar7 = "getsockname() failed: %s";
      goto LAB_001172e9;
    }
    pcVar9 = local_438;
    Curl_inet_ntop((uint)local_9b8[0].sa_family,local_9b8[0].sa_data + 2,pcVar9,0x401);
  }
  ai = (Curl_addrinfo *)0x0;
  local_9f8 = pSVar15;
  Curl_resolv(conn,pcVar9,0,&local_9c0);
  if (local_9c0 != (Curl_dns_entry *)0x0) {
    ai = local_9c0->addr;
    Curl_resolv_unlock(local_9f8,local_9c0);
  }
  if (ai != (Curl_addrinfo *)0x0) {
    local_9e8 = uVar13;
    if (pcVar8 != (char *)0x0) {
      (*Curl_cfree)(pcVar8);
    }
    local_9fc = -1;
    iVar6 = 0;
    local_9e0 = conn;
    CVar5 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)0x0,&local_9fc);
    if (CVar5 == CURLE_OK) {
      bVar18 = false;
      uVar10 = 0;
    }
    else {
      piVar11 = __errno_location();
      do {
        uVar10 = (ulong)CVar5;
        iVar6 = *piVar11;
        ai = ai->ai_next;
        bVar18 = ai == (Curl_addrinfo *)0x0;
        if (bVar18) break;
        uVar10 = 0;
        CVar5 = Curl_socket(local_9e0,ai,(Curl_sockaddr_ex *)0x0,&local_9fc);
      } while (CVar5 != CURLE_OK);
    }
    local_9c8 = uVar10;
    if (bVar18) {
      pcVar9 = Curl_strerror(local_9e0,iVar6);
      Curl_failf(local_9f8,"socket failure: %s",pcVar9);
    }
    else {
      memcpy(local_9b8,ai->ai_addr,(ulong)ai->ai_addrlen);
      conn_00 = local_9e0;
      local_9f0 = ai->ai_addrlen;
      uVar3 = (ushort)local_9ec;
      if (uVar3 < (ushort)local_9e8) {
LAB_0011736f:
        Curl_failf(local_9f8,"bind() failed, we ran out of ports!");
      }
      else {
        local_9d0 = (pingpong *)&local_9e0->proto;
        do {
          bVar18 = false;
          uVar13 = local_9e8;
          while( true ) {
            if (local_9b8[0].sa_family == 2) {
              local_9b8[0].sa_data._0_2_ = (ushort)uVar13 << 8 | (ushort)uVar13 >> 8;
            }
            iVar6 = bind(local_9fc,local_9b8,local_9f0);
            if (iVar6 == 0) {
              if (bVar18) goto LAB_0011736f;
              local_9f0 = 0x80;
              iVar6 = getsockname(local_9fc,local_9b8,&local_9f0);
              if (iVar6 != 0) {
                piVar11 = __errno_location();
                iVar6 = *piVar11;
                goto LAB_001174dd;
              }
              iVar6 = listen(local_9fc,1);
              if (iVar6 != 0) {
                piVar11 = __errno_location();
                pcVar9 = Curl_strerror(conn_00,*piVar11);
                pcVar7 = "socket failure: %s";
                goto LAB_00117546;
              }
              Curl_printable_address(ai,local_938,0x100);
              pSVar15 = local_9f8;
              CVar5 = (CURLcode)local_9c8;
              fVar16 = local_9d4;
              if (local_9d4 == DONE) goto LAB_001175c5;
              goto LAB_00117598;
            }
            piVar11 = __errno_location();
            iVar6 = *piVar11;
            if ((iVar6 == 99 & (byte)local_9e4) == 1) break;
            if ((iVar6 != 0xd) && (iVar6 != 0x62)) {
              pcVar9 = Curl_strerror(conn_00,iVar6);
              Curl_failf(local_9f8,"bind(port=%hu) failed: %s",(ulong)(uVar13 & 0xffff),pcVar9);
              goto LAB_00117382;
            }
            uVar13 = uVar13 + 1;
            bVar18 = uVar3 < (ushort)uVar13;
            if (uVar3 < (ushort)uVar13) goto LAB_0011736f;
          }
          local_9d8 = uVar13 & 0xffff;
          pcVar9 = Curl_strerror(conn_00,99);
          local_9e4 = 0;
          Curl_infof(local_9f8,"bind(port=%hu) on non-local address failed: %s\n",(ulong)local_9d8,
                     pcVar9);
          local_9f0 = 0x80;
          iVar6 = getsockname(conn_00->sock[0],local_9b8,&local_9f0);
        } while (iVar6 == 0);
        iVar6 = *piVar11;
LAB_001174dd:
        pcVar9 = Curl_strerror(conn_00,iVar6);
        pcVar7 = "getsockname() failed: %s";
LAB_00117546:
        Curl_failf(local_9f8,pcVar7,pcVar9);
      }
LAB_00117382:
      Curl_closesocket(conn_00,local_9fc);
    }
    return CURLE_FTP_PORT_FAILED;
  }
  pcVar7 = "failed to resolve the address provided to PORT: %s";
  pSVar15 = local_9f8;
LAB_001172e9:
  Curl_failf(pSVar15,pcVar7,pcVar9);
  if (pcVar8 != (char *)0x0) {
    (*Curl_cfree)(pcVar8);
  }
  return CURLE_FTP_PORT_FAILED;
LAB_00117598:
  do {
    if (((fVar16 != EPRT) || ((conn_00->bits).ftp_use_eprt != false)) &&
       (local_9b8[0].sa_family == 2)) {
      if (fVar16 == EPRT) {
        CVar5 = CURLE_OK;
        error = Curl_pp_sendf(local_9d0,"%s |%d|%s|%hu|",ftp_state_use_port::mode,1,local_938,
                              (ulong)(ushort)(local_9b8[0].sa_data._0_2_ << 8 |
                                             (ushort)local_9b8[0].sa_data._0_2_ >> 8));
        if (error != CURLE_OK) {
          pcVar9 = curl_easy_strerror(error);
          Curl_failf(local_9f8,"Failure sending EPRT command: %s",pcVar9);
          Curl_closesocket(conn_00,local_9fc);
          (conn_00->proto).ftpc.count1 = 1;
          (conn_00->proto).ftpc.state = FTP_STOP;
          return error;
        }
        goto LAB_001175c5;
      }
      if (fVar16 == PORT) {
        lVar12 = 0;
        while( true ) {
          cVar1 = local_938[lVar12];
          cVar14 = ',';
          if ((cVar1 != '.') && (cVar14 = cVar1, cVar1 == '\0')) break;
          local_838[lVar12] = cVar14;
          lVar12 = lVar12 + 1;
        }
        local_838[lVar12] = '\0';
        curl_msnprintf(local_838 + lVar12,0x14,",%d,%d",(ulong)(local_9b8[0].sa_data._0_2_ & 0xff),
                       (ulong)SUB21(local_9b8[0].sa_data._0_2_,1));
        CVar5 = Curl_pp_sendf(local_9d0,"%s %s",0x13b1d5,local_838);
        if (CVar5 != CURLE_OK) {
          pcVar9 = curl_easy_strerror(CVar5);
          Curl_failf(pSVar15,"Failure sending PORT command: %s",pcVar9);
          Curl_closesocket(conn_00,local_9fc);
          (conn_00->proto).ftpc.state = FTP_STOP;
          return CVar5;
        }
        goto LAB_001175c5;
      }
    }
    fVar16 = fVar16 + PORT;
  } while (fVar16 != DONE);
  fVar16 = DONE;
LAB_001175c5:
  (conn_00->proto).ftpc.count1 = fVar16;
  if (conn_00->sock[1] != -1) {
    Curl_closesocket(conn_00,conn_00->sock[1]);
  }
  conn_00->sock[1] = local_9fc;
  (conn_00->bits).tcpconnect[1] = true;
  (conn_00->proto).ftpc.state = FTP_PORT;
  return CVar5;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct SessionHandle *data=conn->data;
  curl_socket_t portsock= CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa=(struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h=NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;

  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen+1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      if((ip_end = strchr(string_ftpport, ']')) != NULL )
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
    }
    else if((ip_end = strchr(string_ftpport, ':')) != NULL) {
        /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
      if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
        /* ipv6 */
        port_min = port_max = 0;
        strcpy(addr, string_ftpport);
        ip_end = NULL; /* this got no port ! */
      }
      else
#endif
        /* (ipv4|domain|interface):port(-range) */
        strncpy(addr, string_ftpport, ip_end - ip_start );
    }
    else
      /* ipv4|interface */
      strcpy(addr, string_ftpport);

    /* parse the port */
    if(ip_end != NULL) {
      if((port_start = strchr(ip_end, ':')) != NULL) {
        port_min = curlx_ultous(strtoul(port_start+1, NULL, 10));
        if((port_sep = strchr(port_start, '-')) != NULL) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711 , in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max )
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      if(!Curl_if2ip(conn->ip_addr->ai_family, addr,
                     hbuf, sizeof(hbuf)))
        /* not an interface, use the given string as host name instead */
        host = addr;
      else
        host = hbuf; /* use the hbuf for host name */
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */

    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
      Curl_safefree(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    Curl_safefree(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  Curl_safefree(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s", Curl_strerror(conn, error));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */

        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(conn, error) );

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(conn, SOCKERRNO) );
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      else if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(conn, error) );
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s", Curl_strerror(conn, SOCKERRNO));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is ipv4 only */
      continue;

    switch (sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    else if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest=',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      snprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}